

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O3

bool __thiscall
Parameter<std::__cxx11::string>::internalSetData<std::vector<double,std::allocator<double>>>
          (Parameter<std::__cxx11::string> *this,vector<double,_std::allocator<double>_> *data)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tmp;
  vector<double,_std::allocator<double>_> local_28;
  
  std::vector<double,_std::allocator<double>_>::vector(&local_28,data);
  if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return false;
}

Assistant:

static bool convert(RepType v, RepType& r) {
    r = v;
    return true;
  }